

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cor_broker.cpp
# Opt level: O0

int main(void)

{
  ostream *poVar1;
  undefined1 local_c0 [8];
  DoubleAttackModifier dam;
  allocator<char> local_81;
  string local_80;
  undefined1 local_60 [8];
  Creature goblin;
  undefined1 local_28 [8];
  Game g;
  
  g.queries._pimpl.pn.pi_._4_4_ = 0;
  boost::signals2::
  signal<void_(Query_&),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_(Query_&)>,_boost::function<void_(const_boost::signals2::connection_&,_Query_&)>,_boost::signals2::mutex>
  ::signal((signal<void_(Query_&),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_(Query_&)>,_boost::function<void_(const_boost::signals2::connection_&,_Query_&)>,_boost::signals2::mutex>
            *)local_28,(int)&goblin + 0x2f,(__sighandler_t)(goblin.name.field_2._M_local_buf + 0xe))
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"Goblin",&local_81);
  Creature::Creature((Creature *)local_60,(Game *)local_28,&local_80,2,2);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator(&local_81);
  poVar1 = operator<<((ostream *)&std::cout,(Creature *)local_60);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  DoubleAttackModifier::DoubleAttackModifier
            ((DoubleAttackModifier *)local_c0,(Game *)local_28,(Creature *)local_60);
  poVar1 = operator<<((ostream *)&std::cout,(Creature *)local_60);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  DoubleAttackModifier::~DoubleAttackModifier((DoubleAttackModifier *)local_c0);
  poVar1 = operator<<((ostream *)&std::cout,(Creature *)local_60);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  g.queries._pimpl.pn.pi_._4_4_ = 0;
  Creature::~Creature((Creature *)local_60);
  Game::~Game((Game *)local_28);
  return g.queries._pimpl.pn.pi_._4_4_;
}

Assistant:

int main()
{
	Game g{};
	Creature goblin{g, "Goblin", 2, 2};
	std::cout << goblin << std::endl;

	{
		DoubleAttackModifier dam{g, goblin};
		std::cout << goblin << std::endl;
	}

	std::cout << goblin << std::endl;
	return 0;
}